

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stage_module.h
# Opt level: O2

void __thiscall
shift_window_transformer::StageModule<float>::StageModule
          (StageModule<float> *this,int in_channels,int hidden_dimension,int layers_cnt,
          int downscaling_factor,int num_heads,int head_dim,int window_size,
          bool relative_pos_embedding)

{
  SwinBlock<float> *pSVar1;
  int iVar2;
  SwinBlock<float> *ptr2;
  SwinBlock<float> *ptr1;
  
  (this->super_Layer<float>)._vptr_Layer = (_func_int **)&PTR_forward_0010ba28;
  PatchMerging<float>::PatchMerging
            (&this->patch_partition,in_channels,hidden_dimension,downscaling_factor);
  (this->layers).
  super__Vector_base<shift_window_transformer::SwinBlock<float>_*,_std::allocator<shift_window_transformer::SwinBlock<float>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->layers).
  super__Vector_base<shift_window_transformer::SwinBlock<float>_*,_std::allocator<shift_window_transformer::SwinBlock<float>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->layers).
  super__Vector_base<shift_window_transformer::SwinBlock<float>_*,_std::allocator<shift_window_transformer::SwinBlock<float>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((layers_cnt & 1U) == 0) {
    for (iVar2 = 0; iVar2 < layers_cnt; iVar2 = iVar2 + 2) {
      pSVar1 = (SwinBlock<float> *)operator_new(0x38);
      SwinBlock<float>::SwinBlock
                (pSVar1,hidden_dimension,num_heads,head_dim,hidden_dimension * 4,false,window_size,
                 relative_pos_embedding);
      ptr1 = pSVar1;
      pSVar1 = (SwinBlock<float> *)operator_new(0x38);
      SwinBlock<float>::SwinBlock
                (pSVar1,hidden_dimension,num_heads,head_dim,hidden_dimension * 4,true,window_size,
                 relative_pos_embedding);
      ptr2 = pSVar1;
      std::
      vector<shift_window_transformer::SwinBlock<float>_*,_std::allocator<shift_window_transformer::SwinBlock<float>_*>_>
      ::push_back(&this->layers,&ptr1);
      std::
      vector<shift_window_transformer::SwinBlock<float>_*,_std::allocator<shift_window_transformer::SwinBlock<float>_*>_>
      ::push_back(&this->layers,&ptr2);
    }
    return;
  }
  __assert_fail("layers_cnt % 2 == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/dianhsu[P]swin-transformer-cpp/model/stage_module.h"
                ,0x16,
                "shift_window_transformer::StageModule<float>::StageModule(int, int, int, int, int, int, int, bool) [T = float]"
               );
}

Assistant:

StageModule(int in_channels, int hidden_dimension, int layers_cnt, int downscaling_factor, int num_heads,
                    int head_dim, int window_size, bool relative_pos_embedding) : patch_partition(in_channels,
                                                                                                  hidden_dimension,
                                                                                                  downscaling_factor) {
            assert(layers_cnt % 2 == 0);

            for (int i = 0; i < layers_cnt; i += 2) {
                auto ptr1 = new SwinBlock<T>(hidden_dimension, num_heads, head_dim, hidden_dimension * 4, false,
                                             window_size,
                                             relative_pos_embedding);
                auto ptr2 = new SwinBlock<T>(hidden_dimension, num_heads, head_dim, hidden_dimension * 4, true,
                                             window_size,
                                             relative_pos_embedding);
                layers.push_back(ptr1);
                layers.push_back(ptr2);
            }
        }